

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode_blocks(lzx_stream *strm,wchar_t last)

{
  char cVar1;
  uchar uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  lzx_pos_tbl *plVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  int iVar16;
  huffman *hf;
  huffman *hf_00;
  huffman *hf_01;
  uchar *puVar17;
  uchar *__src;
  wchar_t local_f4;
  wchar_t li;
  uchar *d;
  wchar_t l;
  uchar *s;
  wchar_t offbits;
  wchar_t wStack_cc;
  char block_type;
  wchar_t state;
  wchar_t r2;
  wchar_t r1;
  wchar_t r0;
  wchar_t position_slot;
  wchar_t offset_bits;
  wchar_t length_header;
  wchar_t w_size;
  wchar_t w_mask;
  wchar_t w_pos;
  wchar_t copy_pos;
  wchar_t copy_len;
  wchar_t c;
  wchar_t mt_max_bits;
  wchar_t lt_max_bits;
  wchar_t at_max_bits;
  size_t block_bytes_avail;
  uchar *mt_bitlen;
  uchar *lt_bitlen;
  uchar *at_bitlen;
  uchar *w_buff;
  uchar *endp;
  uchar *noutp;
  lzx_pos_tbl *pos_tbl;
  huffman *mt;
  huffman *lt;
  huffman *at;
  lzx_br bre;
  lzx_dec *ds;
  wchar_t last_local;
  lzx_stream *strm_local;
  
  bre._8_8_ = strm->ds;
  at = (huffman *)(((lzx_dec *)bre._8_8_)->br).cache_buffer;
  bre.cache_buffer._0_4_ = (((lzx_dec *)bre._8_8_)->br).cache_avail;
  bre.cache_buffer._4_1_ = (((lzx_dec *)bre._8_8_)->br).odd;
  bre.cache_buffer._5_1_ = (((lzx_dec *)bre._8_8_)->br).have_odd;
  bre.cache_buffer._6_2_ = *(undefined2 *)&(((lzx_dec *)bre._8_8_)->br).field_0xe;
  hf = &((lzx_dec *)bre._8_8_)->at;
  hf_00 = &((lzx_dec *)bre._8_8_)->lt;
  hf_01 = &((lzx_dec *)bre._8_8_)->mt;
  plVar8 = ((lzx_dec *)bre._8_8_)->pos_tbl;
  endp = strm->next_out;
  puVar17 = endp + strm->avail_out;
  puVar9 = ((lzx_dec *)bre._8_8_)->w_buff;
  puVar10 = (((lzx_dec *)bre._8_8_)->at).bitlen;
  puVar11 = (((lzx_dec *)bre._8_8_)->lt).bitlen;
  puVar12 = (((lzx_dec *)bre._8_8_)->mt).bitlen;
  _lt_max_bits = ((lzx_dec *)bre._8_8_)->block_bytes_avail;
  wVar3 = (((lzx_dec *)bre._8_8_)->at).max_bits;
  wVar4 = (((lzx_dec *)bre._8_8_)->lt).max_bits;
  wVar5 = (((lzx_dec *)bre._8_8_)->mt).max_bits;
  w_pos = ((lzx_dec *)bre._8_8_)->copy_len;
  w_mask = ((lzx_dec *)bre._8_8_)->copy_pos;
  w_size = ((lzx_dec *)bre._8_8_)->w_pos;
  wVar6 = ((lzx_dec *)bre._8_8_)->w_mask;
  wVar7 = ((lzx_dec *)bre._8_8_)->w_size;
  position_slot = ((lzx_dec *)bre._8_8_)->length_header;
  r0 = ((lzx_dec *)bre._8_8_)->offset_bits;
  r1 = ((lzx_dec *)bre._8_8_)->position_slot;
  r2 = ((lzx_dec *)bre._8_8_)->r0;
  state = ((lzx_dec *)bre._8_8_)->r1;
  wStack_cc = ((lzx_dec *)bre._8_8_)->r2;
  offbits = ((lzx_dec *)bre._8_8_)->state;
  cVar1 = ((lzx_dec *)bre._8_8_)->block_type;
switchD_0065fb70_default:
  wVar15 = state;
  wVar14 = wStack_cc;
  switch(offbits) {
  case L'\x12':
    while( true ) {
      if (_lt_max_bits == 0) {
        *(undefined4 *)bre._8_8_ = 2;
        *(huffman **)(bre._8_8_ + 0x68) = at;
        *(uint64_t *)(bre._8_8_ + 0x70) = bre.cache_buffer;
        *(undefined8 *)(bre._8_8_ + 0x38) = 0;
        *(wchar_t *)(bre._8_8_ + 0x20) = w_pos;
        *(wchar_t *)(bre._8_8_ + 0x1c) = w_mask;
        *(wchar_t *)(bre._8_8_ + 0x54) = position_slot;
        *(wchar_t *)(bre._8_8_ + 0x58) = r1;
        *(wchar_t *)(bre._8_8_ + 0x40) = r2;
        *(wchar_t *)(bre._8_8_ + 0x44) = state;
        *(wchar_t *)(bre._8_8_ + 0x48) = wStack_cc;
        *(wchar_t *)(bre._8_8_ + 0x18) = w_size;
        strm->avail_out = (long)puVar17 - (long)endp;
        return L'\x01';
      }
      if (puVar17 <= endp) goto LAB_00660484;
      if ((((wchar_t)bre.cache_buffer < wVar5) &&
          (wVar13 = lzx_br_fillup(strm,(lzx_br *)&at), wVar13 == L'\0')) &&
         ((wchar_t)bre.cache_buffer < wVar5)) {
        if (last == L'\0') goto LAB_00660484;
        copy_pos = lzx_decode_huffman(hf_01,(uint)((long)at <<
                                                  ((char)wVar5 - (char)bre.cache_buffer & 0x3fU)) &
                                            cache_masks[wVar5]);
        iVar16 = (wchar_t)bre.cache_buffer - (uint)puVar12[copy_pos];
        bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar16);
        if (iVar16 < 0) goto LAB_0066046a;
      }
      else {
        copy_pos = lzx_decode_huffman(hf_01,(uint)((ulong)at >>
                                                  ((char)bre.cache_buffer - (char)wVar5 & 0x3fU)) &
                                            cache_masks[wVar5]);
        bre.cache_buffer =
             CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - (uint)puVar12[copy_pos]);
      }
      if (L'ÿ' < copy_pos) break;
      puVar9[w_size] = (uchar)copy_pos;
      w_size = w_size + L'\x01' & wVar6;
      *endp = (uchar)copy_pos;
      _lt_max_bits = _lt_max_bits - 1;
      endp = endp + 1;
    }
    position_slot = copy_pos + L'\xffffff00' & 7;
    r1 = copy_pos + L'\xffffff00' >> 3;
    break;
  case L'\x14':
    goto switchD_0065fb70_caseD_14;
  case L'\x15':
    goto switchD_0065fb70_caseD_15;
  case L'\x16':
    goto switchD_0065fb70_caseD_16;
  default:
    goto switchD_0065fb70_default;
  }
  if (position_slot == L'\a') {
    if ((((wchar_t)bre.cache_buffer < wVar4) &&
        (wVar13 = lzx_br_fillup(strm,(lzx_br *)&at), wVar13 == L'\0')) &&
       ((wchar_t)bre.cache_buffer < wVar4)) {
      if (last == L'\0') {
        offbits = L'\x13';
        goto LAB_00660484;
      }
      copy_pos = lzx_decode_huffman(hf_00,(uint)((long)at <<
                                                ((char)wVar4 - (char)bre.cache_buffer & 0x3fU)) &
                                          cache_masks[wVar4]);
      iVar16 = (wchar_t)bre.cache_buffer - (uint)puVar11[copy_pos];
      bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar16);
      if (iVar16 < 0) goto LAB_0066046a;
    }
    else {
      copy_pos = lzx_decode_huffman(hf_00,(uint)((ulong)at >>
                                                ((char)bre.cache_buffer - (char)wVar4 & 0x3fU)) &
                                          cache_masks[wVar4]);
      bre.cache_buffer =
           CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - (uint)puVar11[copy_pos]);
    }
    w_pos = copy_pos + L'\t';
  }
  else {
    w_pos = position_slot + L'\x02';
  }
  if (_lt_max_bits < (ulong)(long)w_pos) goto LAB_0066046a;
  if (r1 == L'\0') {
    w_mask = r2;
    offbits = L'\x15';
  }
  else {
    if (r1 != L'\x01') {
      if (r1 == L'\x02') {
        w_mask = wStack_cc;
        wStack_cc = r2;
        r2 = wVar14;
        offbits = L'\x15';
        goto switchD_0065fb70_default;
      }
      r0 = plVar8[r1].footer_bits;
switchD_0065fb70_caseD_14:
      if ((cVar1 == '\x02') && (L'\x02' < r0)) {
        wVar14 = r0 + L'\xfffffffd';
        if (((wVar14 <= (wchar_t)bre.cache_buffer) ||
            (wVar15 = lzx_br_fillup(strm,(lzx_br *)&at), wVar15 != L'\0')) ||
           (wVar14 <= (wchar_t)bre.cache_buffer)) {
          w_mask = ((uint)((ulong)at >> ((char)bre.cache_buffer - (char)wVar14 & 0x3fU)) &
                   cache_masks[wVar14]) * 8;
          if ((((wchar_t)bre.cache_buffer < wVar14 + wVar3) &&
              (wVar15 = lzx_br_fillup(strm,(lzx_br *)&at), wVar15 == L'\0')) &&
             ((wchar_t)bre.cache_buffer < wVar14 + wVar3)) {
            if (last == L'\0') {
              offbits = L'\x14';
              goto LAB_00660484;
            }
            iVar16 = (wchar_t)bre.cache_buffer - wVar14;
            bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar16);
            copy_pos = lzx_decode_huffman(hf,(uint)((long)at << ((char)wVar3 - (char)iVar16 & 0x3fU)
                                                   ) & cache_masks[wVar3]);
            iVar16 = (wchar_t)bre.cache_buffer - (uint)puVar10[copy_pos];
            bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar16);
            if (iVar16 < 0) goto LAB_0066046a;
          }
          else {
            iVar16 = (wchar_t)bre.cache_buffer - wVar14;
            bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar16);
            copy_pos = lzx_decode_huffman(hf,(uint)((ulong)at >>
                                                   ((char)iVar16 - (char)wVar3 & 0x3fU)) &
                                             cache_masks[wVar3]);
            bre.cache_buffer =
                 CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - (uint)puVar10[copy_pos]
                         );
          }
          w_mask = copy_pos + w_mask;
LAB_006601e2:
          w_mask = plVar8[r1].base + L'\xfffffffe' + w_mask;
          wStack_cc = state;
          state = r2;
          r2 = w_mask;
switchD_0065fb70_caseD_15:
          w_mask = w_size - w_mask & wVar6;
switchD_0065fb70_caseD_16:
          while( true ) {
            d._4_4_ = w_pos;
            if (w_size < w_mask) {
              if (wVar7 - w_mask < w_pos) {
                d._4_4_ = wVar7 - w_mask;
              }
            }
            else if (wVar7 - w_size < w_pos) {
              d._4_4_ = wVar7 - w_size;
            }
            if (puVar17 <= endp + d._4_4_) {
              d._4_4_ = (int)puVar17 - (int)endp;
            }
            __src = puVar9 + w_mask;
            if ((d._4_4_ < L'\b') || ((w_size <= w_mask + d._4_4_ && (w_mask <= w_size + d._4_4_))))
            {
              for (local_f4 = L'\0'; local_f4 < d._4_4_; local_f4 = local_f4 + L'\x01') {
                uVar2 = __src[local_f4];
                puVar9[(long)local_f4 + (long)w_size] = uVar2;
                endp[local_f4] = uVar2;
              }
            }
            else {
              memcpy(puVar9 + w_size,__src,(long)d._4_4_);
              memcpy(endp,__src,(long)d._4_4_);
            }
            endp = endp + d._4_4_;
            w_mask = w_mask + d._4_4_ & wVar6;
            w_size = w_size + d._4_4_ & wVar6;
            _lt_max_bits = _lt_max_bits - (long)d._4_4_;
            if (w_pos <= d._4_4_) break;
            w_pos = w_pos - d._4_4_;
            if (puVar17 <= endp) {
              offbits = L'\x16';
              goto LAB_00660484;
            }
          }
          offbits = L'\x12';
          goto switchD_0065fb70_default;
        }
      }
      else if ((r0 <= (wchar_t)bre.cache_buffer) ||
              ((wVar14 = lzx_br_fillup(strm,(lzx_br *)&at), wVar14 != L'\0' ||
               (r0 <= (wchar_t)bre.cache_buffer)))) {
        w_mask = (uint)((ulong)at >> ((char)bre.cache_buffer - (char)r0 & 0x3fU)) & cache_masks[r0];
        bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - r0);
        goto LAB_006601e2;
      }
      offbits = L'\x14';
      if (last == L'\0') {
LAB_00660484:
        *(huffman **)(bre._8_8_ + 0x68) = at;
        *(uint64_t *)(bre._8_8_ + 0x70) = bre.cache_buffer;
        *(size_t *)(bre._8_8_ + 0x38) = _lt_max_bits;
        *(wchar_t *)(bre._8_8_ + 0x20) = w_pos;
        *(wchar_t *)(bre._8_8_ + 0x1c) = w_mask;
        *(wchar_t *)(bre._8_8_ + 0x54) = position_slot;
        *(wchar_t *)(bre._8_8_ + 0x5c) = r0;
        *(wchar_t *)(bre._8_8_ + 0x58) = r1;
        *(wchar_t *)(bre._8_8_ + 0x40) = r2;
        *(wchar_t *)(bre._8_8_ + 0x44) = state;
        *(wchar_t *)(bre._8_8_ + 0x48) = wStack_cc;
        *(wchar_t *)bre._8_8_ = offbits;
        *(wchar_t *)(bre._8_8_ + 0x18) = w_size;
        strm->avail_out = (long)puVar17 - (long)endp;
        return L'\0';
      }
LAB_0066046a:
      *(undefined4 *)(bre._8_8_ + 0x21c) = 0xffffffe7;
      return L'\xffffffe7';
    }
    w_mask = state;
    state = r2;
    r2 = wVar15;
    offbits = L'\x15';
  }
  goto switchD_0065fb70_default;
}

Assistant:

static int
lzx_decode_blocks(struct lzx_stream *strm, int last)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br bre = ds->br;
	struct huffman *at = &(ds->at), *lt = &(ds->lt), *mt = &(ds->mt);
	const struct lzx_pos_tbl *pos_tbl = ds->pos_tbl;
	unsigned char *noutp = strm->next_out;
	unsigned char *endp = noutp + strm->avail_out;
	unsigned char *w_buff = ds->w_buff;
	unsigned char *at_bitlen = at->bitlen;
	unsigned char *lt_bitlen = lt->bitlen;
	unsigned char *mt_bitlen = mt->bitlen;
	size_t block_bytes_avail = ds->block_bytes_avail;
	int at_max_bits = at->max_bits;
	int lt_max_bits = lt->max_bits;
	int mt_max_bits = mt->max_bits;
	int c, copy_len = ds->copy_len, copy_pos = ds->copy_pos;
	int w_pos = ds->w_pos, w_mask = ds->w_mask, w_size = ds->w_size;
	int length_header = ds->length_header;
	int offset_bits = ds->offset_bits;
	int position_slot = ds->position_slot;
	int r0 = ds->r0, r1 = ds->r1, r2 = ds->r2;
	int state = ds->state;
	char block_type = ds->block_type;

	for (;;) {
		switch (state) {
		case ST_MAIN:
			for (;;) {
				if (block_bytes_avail == 0) {
					/* This block ended. */
					ds->state = ST_RD_BLOCK_TYPE;
					ds->br = bre;
					ds->block_bytes_avail =
					    block_bytes_avail;
					ds->copy_len = copy_len;
					ds->copy_pos = copy_pos;
					ds->length_header = length_header;
					ds->position_slot = position_slot;
					ds->r0 = r0; ds->r1 = r1; ds->r2 = r2;
					ds->w_pos = w_pos;
					strm->avail_out = endp - noutp;
					return (ARCHIVE_EOF);
				}
				if (noutp >= endp)
					/* Output buffer is empty. */
					goto next_data;

				if (!lzx_br_read_ahead(strm, &bre,
				    mt_max_bits)) {
					if (!last)
						goto next_data;
					/* Remaining bits are less than
					 * maximum bits(mt.max_bits) but maybe
					 * it still remains as much as we need,
					 * so we should try to use it with
					 * dummy bits. */
					c = lzx_decode_huffman(mt,
					      lzx_br_bits_forced(
				 	        &bre, mt_max_bits));
					lzx_br_consume(&bre, mt_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzx_decode_huffman(mt,
					      lzx_br_bits(&bre, mt_max_bits));
					lzx_br_consume(&bre, mt_bitlen[c]);
				}
				if (c > UCHAR_MAX)
					break;
				/*
				 * 'c' is exactly literal code.
				 */
				/* Save a decoded code to reference it
				 * afterward. */
				w_buff[w_pos] = c;
				w_pos = (w_pos + 1) & w_mask;
				/* Store the decoded code to output buffer. */
				*noutp++ = c;
				block_bytes_avail--;
			}
			/*
			 * Get a match code, its length and offset.
			 */
			c -= UCHAR_MAX + 1;
			length_header = c & 7;
			position_slot = c >> 3;
			/* FALL THROUGH */
		case ST_LENGTH:
			/*
			 * Get a length.
			 */
			if (length_header == 7) {
				if (!lzx_br_read_ahead(strm, &bre,
				    lt_max_bits)) {
					if (!last) {
						state = ST_LENGTH;
						goto next_data;
					}
					c = lzx_decode_huffman(lt,
					      lzx_br_bits_forced(
					        &bre, lt_max_bits));
					lzx_br_consume(&bre, lt_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzx_decode_huffman(lt,
					    lzx_br_bits(&bre, lt_max_bits));
					lzx_br_consume(&bre, lt_bitlen[c]);
				}
				copy_len = c + 7 + 2;
			} else
				copy_len = length_header + 2;
			if ((size_t)copy_len > block_bytes_avail)
				goto failed;
			/*
			 * Get an offset.
			 */
			switch (position_slot) {
			case 0: /* Use repeated offset 0. */
				copy_pos = r0;
				state = ST_REAL_POS;
				continue;
			case 1: /* Use repeated offset 1. */
				copy_pos = r1;
				/* Swap repeated offset. */
				r1 = r0;
				r0 = copy_pos;
				state = ST_REAL_POS;
				continue;
			case 2: /* Use repeated offset 2. */
				copy_pos = r2;
				/* Swap repeated offset. */
				r2 = r0;
				r0 = copy_pos;
				state = ST_REAL_POS;
				continue;
			default:
				offset_bits =
				    pos_tbl[position_slot].footer_bits;
				break;
			}
			/* FALL THROUGH */
		case ST_OFFSET:
			/*
			 * Get the offset, which is a distance from
			 * current window position.
			 */
			if (block_type == ALIGNED_OFFSET_BLOCK &&
			    offset_bits >= 3) {
				int offbits = offset_bits - 3;

				if (!lzx_br_read_ahead(strm, &bre, offbits)) {
					state = ST_OFFSET;
					if (last)
						goto failed;
					goto next_data;
				}
				copy_pos = lzx_br_bits(&bre, offbits) << 3;

				/* Get an aligned number. */
				if (!lzx_br_read_ahead(strm, &bre,
				    offbits + at_max_bits)) {
					if (!last) {
						state = ST_OFFSET;
						goto next_data;
					}
					lzx_br_consume(&bre, offbits);
					c = lzx_decode_huffman(at,
					      lzx_br_bits_forced(&bre,
					        at_max_bits));
					lzx_br_consume(&bre, at_bitlen[c]);
					if (!lzx_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					lzx_br_consume(&bre, offbits);
					c = lzx_decode_huffman(at,
					      lzx_br_bits(&bre, at_max_bits));
					lzx_br_consume(&bre, at_bitlen[c]);
				}
				/* Add an aligned number. */
				copy_pos += c;
			} else {
				if (!lzx_br_read_ahead(strm, &bre,
				    offset_bits)) {
					state = ST_OFFSET;
					if (last)
						goto failed;
					goto next_data;
				}
				copy_pos = lzx_br_bits(&bre, offset_bits);
				lzx_br_consume(&bre, offset_bits);
			}
			copy_pos += pos_tbl[position_slot].base -2;

			/* Update repeated offset LRU queue. */
			r2 = r1;
			r1 = r0;
			r0 = copy_pos;
			/* FALL THROUGH */
		case ST_REAL_POS:
			/*
			 * Compute a real position in window.
			 */
			copy_pos = (w_pos - copy_pos) & w_mask;
			/* FALL THROUGH */
		case ST_COPY:
			/*
			 * Copy several bytes as extracted data from the window
			 * into the output buffer.
			 */
			for (;;) {
				const unsigned char *s;
				int l;

				l = copy_len;
				if (copy_pos > w_pos) {
					if (l > w_size - copy_pos)
						l = w_size - copy_pos;
				} else {
					if (l > w_size - w_pos)
						l = w_size - w_pos;
				}
				if (noutp + l >= endp)
					l = (int)(endp - noutp);
				s = w_buff + copy_pos;
				if (l >= 8 && ((copy_pos + l < w_pos)
				  || (w_pos + l < copy_pos))) {
					memcpy(w_buff + w_pos, s, l);
					memcpy(noutp, s, l);
				} else {
					unsigned char *d;
					int li;

					d = w_buff + w_pos;
					for (li = 0; li < l; li++)
						noutp[li] = d[li] = s[li];
				}
				noutp += l;
				copy_pos = (copy_pos + l) & w_mask;
				w_pos = (w_pos + l) & w_mask;
				block_bytes_avail -= l;
				if (copy_len <= l)
					/* A copy of current pattern ended. */
					break;
				copy_len -= l;
				if (noutp >= endp) {
					/* Output buffer is empty. */
					state = ST_COPY;
					goto next_data;
				}
			}
			state = ST_MAIN;
			break;
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
next_data:
	ds->br = bre;
	ds->block_bytes_avail = block_bytes_avail;
	ds->copy_len = copy_len;
	ds->copy_pos = copy_pos;
	ds->length_header = length_header;
	ds->offset_bits = offset_bits;
	ds->position_slot = position_slot;
	ds->r0 = r0; ds->r1 = r1; ds->r2 = r2;
	ds->state = state;
	ds->w_pos = w_pos;
	strm->avail_out = endp - noutp;
	return (ARCHIVE_OK);
}